

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteNextChar(WatWriter *this)

{
  ulong size;
  
  if (this->next_char_ - Newline < 2) {
    Stream::WriteU8(this->stream_,10,(char *)0x0,No);
    for (size = (ulong)this->indent_; 0x8d < size; size = size - 0x8e) {
      Stream::WriteData(this->stream_,(anonymous_namespace)::WatWriter::WriteIndent()::s_indent,0x8e
                        ,(char *)0x0,No);
    }
    if (size != 0) {
      Stream::WriteData(this->stream_,(anonymous_namespace)::WatWriter::WriteIndent()::s_indent,size
                        ,(char *)0x0,No);
    }
  }
  else if (this->next_char_ == Space) {
    Stream::WriteU8(this->stream_,0x20,(char *)0x0,No);
  }
  this->next_char_ = None;
  return;
}

Assistant:

void WatWriter::WriteNextChar() {
  switch (next_char_) {
    case NextChar::Space:
      stream_->WriteChar(' ');
      break;
    case NextChar::Newline:
    case NextChar::ForceNewline:
      stream_->WriteChar('\n');
      WriteIndent();
      break;
    case NextChar::None:
      break;
  }
  next_char_ = NextChar::None;
}